

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_tuple<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  TupleBegin TVar4;
  string_view tag_00;
  string_view local_40;
  
  uVar2 = (ulong)(tag._len != 0);
  local_40._ptr = tag._ptr + uVar2;
  lVar3 = tag._len - uVar2;
  local_40._len = 0;
  if (lVar3 != 0) {
    local_40._len = lVar3 - 1;
  }
  TVar4.tag._len = local_40._len;
  TVar4.tag._ptr = local_40._ptr;
  bVar1 = binlog::ToStringVisitor::visit(visitor,TVar4,istream);
  if (!bVar1) {
    while( true ) {
      tag_00 = tag_pop(&local_40);
      if (tag_00._len == 0) break;
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag,tag_00,visitor,istream,max_recursion);
    }
    binlog::ToStringVisitor::visit(visitor);
  }
  return;
}

Assistant:

void visit_tuple(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )

  const bool skip = visitor.visit(mserialize::Visitor::TupleBegin{tag}, istream);
  if (skip) { return; }

  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::TupleEnd{});
}